

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

void __thiscall
CLI::CheckedTransformer::
CheckedTransformer<std::map<std::__cxx11::string,Level,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Level>>>,std::__cxx11::string(*)(std::__cxx11::string)>
          (CheckedTransformer *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
          *mapping,_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   *filter_function)

{
  undefined1 local_100 [96];
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_a0;
  undefined1 local_70 [8];
  anon_class_48_1_b5464bae_for_tfunc tfunc;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  filter_fn;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *filter_function_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
  *mapping_local;
  CheckedTransformer *this_local;
  
  filter_fn._M_invoker = (_Invoker_type)filter_function;
  Validator::Validator(&this->super_Validator);
  ::std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<std::__cxx11::string(*&)(std::__cxx11::string),void>
            ((function<std::__cxx11::string(std::__cxx11::string)> *)
             &tfunc.mapping._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              **)&filter_fn._M_invoker);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
         *)local_70,mapping);
  ::std::function<std::__cxx11::string()>::operator=
            ((function<std::__cxx11::string()> *)this,(anon_class_48_1_b5464bae_for_tfunc *)local_70
            );
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Level>_>_>
         *)local_100,mapping);
  CheckedTransformer<std::map<std::__cxx11::string,Level,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Level>>>,std::__cxx11::string(*)(std::__cxx11::string)>(std::map<std::__cxx11::string,Level,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Level>>>,std::__cxx11::string(*)(std::__cxx11::string))
  ::{lambda()#1}::CheckedTransformer
            ((_lambda___1_ *)(local_100 + 0x30),(anon_class_48_1_b5464bae_for_tfunc *)local_70);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function(&local_a0,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)&tfunc.mapping._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::operator=
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)&(this->super_Validator).func_
             ,(anon_class_128_3_b5d36dc2 *)local_100);
  CheckedTransformer<std::map<std::__cxx11::string,Level,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Level>>>,std::__cxx11::string(*)(std::__cxx11::string)>(std::map<std::__cxx11::string,Level,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Level>>>,std::__cxx11::string(*)(std::__cxx11::string))
  ::{lambda(std::__cxx11::string&)#1}::~CheckedTransformer
            ((_lambda_std____cxx11__string___1_ *)local_100);
  CheckedTransformer<std::map<std::__cxx11::string,Level,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Level>>>,std::__cxx11::string(*)(std::__cxx11::string)>(std::map<std::__cxx11::string,Level,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Level>>>,std::__cxx11::string(*)(std::__cxx11::string))
  ::{lambda()#1}::~CheckedTransformer((_lambda___1_ *)local_70);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)&tfunc.mapping._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

explicit CheckedTransformer(T mapping, F filter_function) {

        static_assert(detail::pair_adaptor<typename detail::element_type<T>::type>::value,
                      "mapping must produce value pairs");
        // Get the type of the contained item - requires a container have ::value_type
        // if the type does not have first_type and second_type, these are both value_type
        using element_t = typename detail::element_type<T>::type;             // Removes (smart) pointers if needed
        using item_t = typename detail::pair_adaptor<element_t>::first_type;  // Is value_type if not a map
        using local_item_t = typename IsMemberType<item_t>::type;             // Will convert bad types to good ones
                                                                              // (const char * to std::string)
        using iteration_type_t = typename detail::pair_adaptor<element_t>::value_type;  // the type of the object pair

        // Make a local copy of the filter function, using a std::function if not one already
        std::function<local_item_t(local_item_t)> filter_fn = filter_function;

        auto tfunc = [mapping]() {
            std::string out("value in ");
            out += detail::generate_map(detail::smart_deref(mapping)) + " OR {";
            out += detail::join(
                detail::smart_deref(mapping),
                [](const iteration_type_t &v) { return detail::to_string(detail::pair_adaptor<element_t>::second(v)); },
                ",");
            out.push_back('}');
            return out;
        };

        desc_function_ = tfunc;

        func_ = [mapping, tfunc, filter_fn](std::string &input) {
            using CLI::detail::lexical_cast;
            local_item_t b;
            bool converted = lexical_cast(input, b);
            if(converted) {
                if(filter_fn) {
                    b = filter_fn(b);
                }
                auto res = detail::search(mapping, b, filter_fn);
                if(res.first) {
                    input = detail::value_string(detail::pair_adaptor<element_t>::second(*res.second));
                    return std::string{};
                }
            }
            for(const auto &v : detail::smart_deref(mapping)) {
                auto output_string = detail::value_string(detail::pair_adaptor<element_t>::second(v));
                if(output_string == input) {
                    return std::string();
                }
            }

            return "Check " + input + " " + tfunc() + " FAILED";
        };
    }